

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O3

int __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  string local_3d8;
  TPZGeoBlend<pzgeom::TPZGeoLinear> local_3b8;
  
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"TPZGeoElRefLess","");
  uVar1 = Hash(&local_3d8);
  iVar2 = TPZGeoEl::ClassId(&this->super_TPZGeoEl);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::TPZGeoBlend(&local_3b8);
  iVar3 = pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::ClassId(&local_3b8);
  local_3b8.super_TPZGeoLinear.super_TPZNodeRep<2,_pztopology::TPZLine>.super_TPZLine.
  super_TPZSavable._vptr_TPZSavable = (TPZSavable)&PTR__TPZGeoBlend_0188ed08;
  lVar4 = 0x1f0;
  do {
    TPZTransform<double>::~TPZTransform
              ((TPZTransform<double> *)
               ((long)local_3b8.super_TPZGeoLinear.super_TPZNodeRep<2,_pztopology::TPZLine>.
                      fNodeIndexes + lVar4 + -8));
    lVar4 = lVar4 + -0x1a0;
  } while (lVar4 != -0x150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}